

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

mem_expr_t find_mem_expr(gen_ctx_t gen_ctx,MIR_insn_t mem_insn)

{
  int iVar1;
  mem_expr_t pmVar2;
  mem_expr_t tab_e;
  mem_expr_t local_10;
  
  if (((*(uint *)&mem_insn->field_0x18 & 0xfffffffc) == 0) &&
     ((mem_insn->ops[0].field_0x8 == '\v' || (*(char *)&mem_insn[1].insn_link.prev == '\v')))) {
    pmVar2 = VARR_mem_expr_tget(gen_ctx->gvn_ctx->mem_exprs,
                                (ulong)*(uint *)((long)mem_insn->data + 0x10));
    iVar1 = HTAB_mem_expr_t_do(gen_ctx->gvn_ctx->mem_expr_tab,pmVar2,HTAB_FIND,&local_10);
    pmVar2 = (mem_expr_t)0x0;
    if (iVar1 != 0) {
      pmVar2 = local_10;
    }
    return pmVar2;
  }
  __assert_fail("move_code_p (mem_insn->code) && (mem_insn->ops[0].mode == MIR_OP_VAR_MEM || mem_insn->ops[1].mode == MIR_OP_VAR_MEM)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0xe90,"mem_expr_t find_mem_expr(gen_ctx_t, MIR_insn_t)");
}

Assistant:

static mem_expr_t find_mem_expr (gen_ctx_t gen_ctx, MIR_insn_t mem_insn) {
  mem_expr_t tab_e, e;

  gen_assert (
    move_code_p (mem_insn->code)
    && (mem_insn->ops[0].mode == MIR_OP_VAR_MEM || mem_insn->ops[1].mode == MIR_OP_VAR_MEM));
  e = VARR_GET (mem_expr_t, mem_exprs, ((bb_insn_t) mem_insn->data)->mem_index);
  if (HTAB_DO (mem_expr_t, mem_expr_tab, e, HTAB_FIND, tab_e)) return tab_e;
  return NULL;
}